

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_batch.c
# Opt level: O3

int write_hypseg(FILE *fh,ps_decoder_t *ps,char *uttid)

{
  FILE *__stream;
  ps_seg_t *ppVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  int32 ef;
  int32 sf;
  int32 wlscr_1;
  int32 ascr;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  char *local_40;
  FILE *local_38;
  
  local_40 = uttid;
  local_38 = (FILE *)fh;
  ppVar1 = ps_seg_iter(ps);
  if (ppVar1 == (ps_seg_t *)0x0) {
    iVar4 = 0;
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    iVar4 = 0;
    do {
      ps_seg_prob(ppVar1,(int32 *)&local_4c,(int32 *)&local_50,(int32 *)0x0);
      iVar4 = iVar4 + local_50;
      uVar3 = uVar3 + local_4c;
      ppVar1 = ps_seg_next(ppVar1);
    } while (ppVar1 != (ps_seg_t *)0x0);
  }
  __stream = local_38;
  fprintf(local_38,"%s S %d T %d A %d L %d",local_40,0,(ulong)(uVar3 + iVar4),(ulong)uVar3,iVar4);
  ppVar1 = ps_seg_iter(ps);
  do {
    pcVar2 = ps_seg_word(ppVar1);
    ps_seg_prob(ppVar1,(int32 *)&local_44,(int32 *)&local_48,(int32 *)0x0);
    ps_seg_frames(ppVar1,(int *)&local_4c,(int *)&local_50);
    fprintf(__stream," %d %d %d %s",(ulong)local_4c,(ulong)local_44,(ulong)local_48,pcVar2);
    ppVar1 = ps_seg_next(ppVar1);
  } while (ppVar1 != (ps_seg_t *)0x0);
  iVar4 = fprintf(__stream," %d\n",(ulong)local_50);
  return iVar4;
}

Assistant:

static int
write_hypseg(FILE *fh, ps_decoder_t *ps, char const *uttid)
{
    int32 ascr, lscr, sf, ef;
    ps_seg_t *itor = ps_seg_iter(ps);

    /* Accumulate language model scores. */
    lscr = 0; ascr = 0;
    while (itor) {
        int32 wlascr, wlscr;
        ps_seg_prob(itor, &wlascr, &wlscr, NULL);
        lscr += wlscr;
        ascr += wlascr;
        itor = ps_seg_next(itor);
    }
    fprintf(fh, "%s S %d T %d A %d L %d", uttid,
            0, /* "scaling factor" which is mostly useless anyway */
            ascr + lscr, ascr, lscr);
    /* Now print out words. */
    itor = ps_seg_iter(ps);
    while (itor) {
        char const *w = ps_seg_word(itor);
        int32 ascr, wlscr;

        ps_seg_prob(itor, &ascr, &wlscr, NULL);
        ps_seg_frames(itor, &sf, &ef);
        fprintf(fh, " %d %d %d %s", sf, ascr, wlscr, w);
        itor = ps_seg_next(itor);
    }
    fprintf(fh, " %d\n", ef);

    return 0;
}